

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SeparatedSyntaxList<slang::syntax::ModportItemSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>>
          (BumpAllocator *this,span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *args)

{
  pointer pTVar1;
  size_t sVar2;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *pSVar3;
  
  pSVar3 = (SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)allocate(this,0x38,8);
  pTVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind = SeparatedList;
  (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pSVar3->super_SyntaxListBase).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pSVar3->super_SyntaxListBase).childCount = sVar2;
  (pSVar3->super_SyntaxListBase)._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00679b50;
  (pSVar3->elements)._M_ptr = pTVar1;
  (pSVar3->elements)._M_extent._M_extent_value = sVar2;
  return pSVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }